

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_unpack_descriptor_array
                  (_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp,int *fds,size_t nfds)

{
  ulong __size;
  int *piVar1;
  void *__ptr;
  int *array;
  uint ii;
  size_t size;
  int64_t idx;
  size_t nfds_local;
  int *fds_local;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  size_t *psStack_10;
  _Bool isbe_local;
  
  if (nvp->nvp_type != 0xc) {
    __assert_fail("nvp->nvp_type == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x3f5,
                  "const unsigned char *nvpair_unpack_descriptor_array(_Bool, nvpair_t *, const unsigned char *, size_t *, const int *, size_t)"
                 );
  }
  __size = nvp->nvp_nitems << 3;
  if ((((nvp->nvp_datasize == __size) && (__size <= *leftp)) && (nvp->nvp_nitems != 0)) &&
     (nvp->nvp_nitems <= __size)) {
    __ptr = malloc(__size);
    if (__ptr == (void *)0x0) {
      psStack_10 = (size_t *)0x0;
    }
    else {
      leftp_local = (size_t *)ptr;
      for (array._4_4_ = 0; (ulong)array._4_4_ < nvp->nvp_nitems; array._4_4_ = array._4_4_ + 1) {
        if (isbe) {
          size = be64dec(leftp_local);
        }
        else {
          size = le64dec(leftp_local);
        }
        if ((long)size < 0) {
          piVar1 = __errno_location();
          *piVar1 = 0x16;
          free(__ptr);
          return (uchar *)0x0;
        }
        if (nfds <= size) {
          piVar1 = __errno_location();
          *piVar1 = 0x16;
          free(__ptr);
          return (uchar *)0x0;
        }
        *(int *)((long)__ptr + (ulong)array._4_4_ * 4) = fds[size];
        leftp_local = leftp_local + 1;
        *leftp = *leftp - 8;
      }
      nvp->nvp_data = (uint64_t)__ptr;
      psStack_10 = leftp_local;
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    psStack_10 = (size_t *)0x0;
  }
  return (uchar *)psStack_10;
}

Assistant:

const unsigned char *
nvpair_unpack_descriptor_array(bool isbe, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp, const int *fds, size_t nfds)
{
	int64_t idx;
	size_t size;
	unsigned int ii;
	int *array;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_DESCRIPTOR_ARRAY);

	size = sizeof(idx) * nvp->nvp_nitems;
	if (nvp->nvp_datasize != size || *leftp < size ||
	    nvp->nvp_nitems == 0 || size < nvp->nvp_nitems) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	array = (int *)nv_malloc(size);
	if (array == NULL)
		return (NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		if (isbe)
			idx = be64dec(ptr);
		else
			idx = le64dec(ptr);

		if (idx < 0) {
			ERRNO_SET(EINVAL);
			nv_free(array);
			return (NULL);
		}

		if ((size_t)idx >= nfds) {
			ERRNO_SET(EINVAL);
			nv_free(array);
			return (NULL);
		}

		array[ii] = (uint64_t)fds[idx];

		ptr += sizeof(idx);
		*leftp -= sizeof(idx);
	}

	nvp->nvp_data = (uint64_t)(uintptr_t)array;

	return (ptr);
}